

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

int get_a32_user_mem_index(DisasContext_conflict1 *s)

{
  ARMMMUIdx AVar1;
  int iVar2;
  
  AVar1 = s->mmu_idx;
  switch(AVar1) {
  case ARMMMUIdx_MUser:
  case ARMMMUIdx_MPriv:
    return 0;
  case ARMMMUIdx_MUserNegPri:
  case ARMMMUIdx_MPrivNegPri:
    iVar2 = 2;
    break;
  case ARMMMUIdx_MSUser:
  case ARMMMUIdx_MSPriv:
    iVar2 = 4;
    break;
  case ARMMMUIdx_MSUserNegPri:
  case ARMMMUIdx_MSPrivNegPri:
    iVar2 = 6;
    break;
  default:
    if (AVar1 - ARMMMUIdx_SE10_0 < 4) {
      return 7;
    }
    if (AVar1 - ARMMMUIdx_E10_1 < 3) {
      return 0;
    }
    if (AVar1 == ARMMMUIdx_E10_0) {
      return 0;
    }
    g_assertion_message_expr
              ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate.c"
               ,0xa2,(char *)0x0);
  }
  return iVar2;
}

Assistant:

static inline int get_a32_user_mem_index(DisasContext *s)
{
    /* Return the core mmu_idx to use for A32/T32 "unprivileged load/store"
     * insns:
     *  if PL2, UNPREDICTABLE (we choose to implement as if PL0)
     *  otherwise, access as if at PL0.
     */
    switch (s->mmu_idx) {
    case ARMMMUIdx_E2:        /* this one is UNPREDICTABLE */
    case ARMMMUIdx_E10_0:
    case ARMMMUIdx_E10_1:
    case ARMMMUIdx_E10_1_PAN:
        return arm_to_core_mmu_idx(ARMMMUIdx_E10_0);
    case ARMMMUIdx_SE3:
    case ARMMMUIdx_SE10_0:
    case ARMMMUIdx_SE10_1:
    case ARMMMUIdx_SE10_1_PAN:
        return arm_to_core_mmu_idx(ARMMMUIdx_SE10_0);
    case ARMMMUIdx_MUser:
    case ARMMMUIdx_MPriv:
        return arm_to_core_mmu_idx(ARMMMUIdx_MUser);
    case ARMMMUIdx_MUserNegPri:
    case ARMMMUIdx_MPrivNegPri:
        return arm_to_core_mmu_idx(ARMMMUIdx_MUserNegPri);
    case ARMMMUIdx_MSUser:
    case ARMMMUIdx_MSPriv:
        return arm_to_core_mmu_idx(ARMMMUIdx_MSUser);
    case ARMMMUIdx_MSUserNegPri:
    case ARMMMUIdx_MSPrivNegPri:
        return arm_to_core_mmu_idx(ARMMMUIdx_MSUserNegPri);
    default:
        g_assert_not_reached();
        // never reach here
        return 0;
    }
}